

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_prop_down.h
# Opt level: O3

void __thiscall
mp::
ConstraintPropagatorsDown<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
::PropagateResult(ConstraintPropagatorsDown<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
                  *this,NotConstraint *con,double lb,double ub,Context ctx)

{
  CtxVal CVar1;
  Context CVar2;
  int var;
  double lb_00;
  double ub_00;
  
  FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
  ::NarrowVarBounds((FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                     *)this,(con->super_FunctionalConstraint).result_var_,lb,ub);
  CVar1 = (con->super_FunctionalConstraint).ctx.value_;
  if (CVar1 - CTX_ROOT < 2) {
    CVar2.value_ = CTX_MIX;
    if (ctx.value_ - CTX_NEG < 2) goto LAB_0020178f;
  }
  else {
    CVar2.value_ = ctx.value_;
    if ((CVar1 == CTX_NONE) ||
       (((CVar1 == CTX_NEG && (ctx.value_ < (CTX_MIX|CTX_ROOT))) &&
        (CVar2.value_ = CTX_MIX, (0x16U >> (ctx.value_ & 0x1f) & 1) != 0)))) {
LAB_0020178f:
      (con->super_FunctionalConstraint).ctx.value_ = CVar2.value_;
    }
  }
  if ((lb == ub) && (!NAN(lb) && !NAN(ub))) {
    lb_00 = 0.0;
    if ((lb != 0.0) || (NAN(lb))) {
      if ((ctx.value_ < (CTX_MIX|CTX_ROOT)) && ((0x16U >> (ctx.value_ & 0x1f) & 1) != 0)) {
        var = (con->
              super_CustomConstraintData<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NotId>).
              args_._M_elems[0];
        if (ctx.value_ - CTX_ROOT < 3) {
          ctx.value_ = *(CtxVal *)(&DAT_00381a1c + (ulong)(ctx.value_ - CTX_ROOT) * 4);
        }
        ub_00 = 0.0;
        goto LAB_00201819;
      }
    }
    else if (ctx.value_ - CTX_NEG < 2) {
      var = (con->super_CustomConstraintData<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NotId>)
            .args_._M_elems[0];
      ctx.value_ = (uint)(ctx.value_ != CTX_NEG) * 2 + CTX_POS;
      lb_00 = 1.0;
      ub_00 = 1.0;
LAB_00201819:
      FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
      ::PropagateResultOfInitExpr
                ((FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                  *)this,var,lb_00,ub_00,ctx);
      FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
      ::DecrementVarUsage((FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                           *)this,(con->super_FunctionalConstraint).result_var_);
      return;
    }
  }
  if (ctx.value_ < CTX_MIX) {
    ctx.value_ = *(CtxVal *)(&DAT_0037d1c0 + (ulong)ctx.value_ * 4);
  }
  FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
  ::PropagateResultOfInitExpr
            ((FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
              *)this,(con->
                     super_CustomConstraintData<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NotId>
                     ).args_._M_elems[0],0.0,1.0,ctx);
  return;
}

Assistant:

void PropagateResult(NotConstraint& con, double lb, double ub, Context ctx) {
    MPD( NarrowVarBounds(con.GetResultVar(), lb, ub) );
    con.AddContext(ctx);
    if (lb==ub) {                         // result fixed
      if (!lb && ctx.HasNegative()) {       // result==0 && ctx-
        MPD( PropagateResultOfInitExpr(con.GetArguments()[0], 1.0, 1.0, -ctx) );
        MPD( DecrementVarUsage(con.GetResultVar()) );
        return;
      } else if (lb && ctx.HasPositive()) { // result==1 && ctx+
        MPD( PropagateResultOfInitExpr(con.GetArguments()[0], 0.0, 0.0, -ctx) );
        MPD( DecrementVarUsage(con.GetResultVar()) );
        return;
      }
    }
    MPD( PropagateResultOfInitExpr(con.GetArguments()[0], 0.0, 1.0, -ctx) );
  }